

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<8,_257,_false,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [12];
  char cVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar31 [16];
  undefined1 auVar30 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  float fVar37;
  undefined1 auVar34 [32];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar39 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  float fVar63;
  vfloat4 a0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar69;
  undefined1 auVar70 [32];
  float fVar71;
  float fVar75;
  float fVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar74 [32];
  float fVar81;
  float fVar86;
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [64];
  float fVar92;
  float fVar97;
  float fVar98;
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  float fVar99;
  undefined1 auVar95 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  undefined1 auVar57 [32];
  undefined1 auVar62 [32];
  undefined1 auVar68 [32];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar44 = ray->tfar;
    if (0.0 <= fVar44) {
      aVar3 = (ray->dir).field_0.field_1;
      auVar30 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
      auVar54 = vrsqrtss_avx(auVar30,auVar30);
      fVar63 = auVar54._0_4_;
      local_1218[0] = fVar63 * 1.5 - auVar30._0_4_ * 0.5 * fVar63 * fVar63 * fVar63;
      fVar63 = (ray->dir).field_0.m128[0];
      auVar46 = vshufps_avx(ZEXT416((uint)local_1218[0]),ZEXT416((uint)local_1218[0]),0);
      auVar64._0_4_ = aVar3.x * auVar46._0_4_;
      auVar64._4_4_ = aVar3.y * auVar46._4_4_;
      auVar64._8_4_ = aVar3.z * auVar46._8_4_;
      auVar64._12_4_ = aVar3.field_3.w * auVar46._12_4_;
      auVar54 = vshufpd_avx(auVar64,auVar64,1);
      auVar30 = vmovshdup_avx(auVar64);
      auVar82._8_4_ = 0x80000000;
      auVar82._0_8_ = 0x8000000080000000;
      auVar82._12_4_ = 0x80000000;
      auVar66._12_4_ = 0;
      auVar66._0_12_ = ZEXT812(0);
      auVar66 = auVar66 << 0x20;
      auVar41 = vunpckhps_avx(auVar64,auVar66);
      auVar58 = vshufps_avx(auVar41,ZEXT416(auVar30._0_4_ ^ 0x80000000),0x41);
      auVar72._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
      auVar72._8_8_ = auVar54._8_8_ ^ auVar82._8_8_;
      auVar41 = vinsertps_avx(auVar72,auVar64,0x2a);
      auVar30 = vdpps_avx(auVar58,auVar58,0x7f);
      auVar54 = vdpps_avx(auVar41,auVar41,0x7f);
      auVar30 = vcmpps_avx(auVar54,auVar30,1);
      auVar30 = vshufps_avx(auVar30,auVar30,0);
      auVar30 = vblendvps_avx(auVar41,auVar58,auVar30);
      auVar54 = vdpps_avx(auVar30,auVar30,0x7f);
      fVar1 = (ray->dir).field_0.m128[1];
      auVar41 = vrsqrtss_avx(auVar54,auVar54);
      fVar69 = auVar41._0_4_;
      fVar2 = (ray->dir).field_0.m128[2];
      auVar54 = ZEXT416((uint)(fVar69 * 1.5 - auVar54._0_4_ * 0.5 * fVar69 * fVar69 * fVar69));
      auVar54 = vshufps_avx(auVar54,auVar54,0);
      auVar73._0_4_ = auVar30._0_4_ * auVar54._0_4_;
      auVar73._4_4_ = auVar30._4_4_ * auVar54._4_4_;
      auVar73._8_4_ = auVar30._8_4_ * auVar54._8_4_;
      auVar73._12_4_ = auVar30._12_4_ * auVar54._12_4_;
      auVar30 = vshufps_avx(auVar73,auVar73,0xc9);
      auVar54 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar93._0_4_ = auVar54._0_4_ * auVar73._0_4_;
      auVar93._4_4_ = auVar54._4_4_ * auVar73._4_4_;
      auVar93._8_4_ = auVar54._8_4_ * auVar73._8_4_;
      auVar93._12_4_ = auVar54._12_4_ * auVar73._12_4_;
      auVar83._0_4_ = auVar30._0_4_ * auVar64._0_4_;
      auVar83._4_4_ = auVar30._4_4_ * auVar64._4_4_;
      auVar83._8_4_ = auVar30._8_4_ * auVar64._8_4_;
      auVar83._12_4_ = auVar30._12_4_ * auVar64._12_4_;
      auVar30 = vsubps_avx(auVar83,auVar93);
      auVar41 = vshufps_avx(auVar30,auVar30,0xc9);
      auVar85 = ZEXT1664(auVar41);
      auVar30 = vdpps_avx(auVar41,auVar41,0x7f);
      auVar96 = ZEXT1664(auVar30);
      auVar54 = vrsqrtss_avx(auVar30,auVar30);
      fVar69 = auVar54._0_4_;
      auVar30 = ZEXT416((uint)(fVar69 * 1.5 - fVar69 * fVar69 * fVar69 * auVar30._0_4_ * 0.5));
      auVar30 = vshufps_avx(auVar30,auVar30,0);
      auVar54._0_4_ = auVar41._0_4_ * auVar30._0_4_;
      auVar54._4_4_ = auVar41._4_4_ * auVar30._4_4_;
      auVar54._8_4_ = auVar41._8_4_ * auVar30._8_4_;
      auVar54._12_4_ = auVar41._12_4_ * auVar30._12_4_;
      auVar30._0_4_ = auVar46._0_4_ * auVar64._0_4_;
      auVar30._4_4_ = auVar46._4_4_ * auVar64._4_4_;
      auVar30._8_4_ = auVar46._8_4_ * auVar64._8_4_;
      auVar30._12_4_ = auVar46._12_4_ * auVar64._12_4_;
      auVar41 = vunpcklps_avx(auVar73,auVar30);
      auVar30 = vunpckhps_avx(auVar73,auVar30);
      auVar46 = vunpcklps_avx(auVar54,auVar66);
      auVar54 = vunpckhps_avx(auVar54,auVar66);
      local_11e8 = vunpcklps_avx(auVar30,auVar54);
      local_1208 = vunpcklps_avx(auVar41,auVar46);
      local_11f8 = vunpckhps_avx(auVar41,auVar46);
      puVar27 = local_11d0;
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar30 = vandps_avx((undefined1  [16])aVar3,auVar41);
      auVar58._8_4_ = 0x219392ef;
      auVar58._0_8_ = 0x219392ef219392ef;
      auVar58._12_4_ = 0x219392ef;
      auVar30 = vcmpps_avx(auVar30,auVar58,1);
      auVar30 = vblendvps_avx((undefined1  [16])aVar3,auVar58,auVar30);
      auVar41 = vrcpps_avx(auVar30);
      fVar69 = auVar41._0_4_;
      auVar46._0_4_ = auVar30._0_4_ * fVar69;
      fVar5 = auVar41._4_4_;
      auVar46._4_4_ = auVar30._4_4_ * fVar5;
      fVar6 = auVar41._8_4_;
      auVar46._8_4_ = auVar30._8_4_ * fVar6;
      fVar35 = auVar41._12_4_;
      auVar46._12_4_ = auVar30._12_4_ * fVar35;
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      auVar30 = vsubps_avx(auVar59,auVar46);
      auVar47._0_4_ = fVar69 + fVar69 * auVar30._0_4_;
      auVar47._4_4_ = fVar5 + fVar5 * auVar30._4_4_;
      auVar47._8_4_ = fVar6 + fVar6 * auVar30._8_4_;
      auVar47._12_4_ = fVar35 + fVar35 * auVar30._12_4_;
      fVar69 = (ray->org).field_0.m128[0];
      auVar106._4_4_ = fVar69;
      auVar106._0_4_ = fVar69;
      auVar106._8_4_ = fVar69;
      auVar106._12_4_ = fVar69;
      auVar106._16_4_ = fVar69;
      auVar106._20_4_ = fVar69;
      auVar106._24_4_ = fVar69;
      auVar106._28_4_ = fVar69;
      fVar5 = (ray->org).field_0.m128[1];
      auVar65._4_4_ = fVar5;
      auVar65._0_4_ = fVar5;
      auVar65._8_4_ = fVar5;
      auVar65._12_4_ = fVar5;
      auVar65._16_4_ = fVar5;
      auVar65._20_4_ = fVar5;
      auVar65._24_4_ = fVar5;
      auVar65._28_4_ = fVar5;
      fVar6 = (ray->org).field_0.m128[2];
      auVar104._4_4_ = fVar6;
      auVar104._0_4_ = fVar6;
      auVar104._8_4_ = fVar6;
      auVar104._12_4_ = fVar6;
      auVar104._16_4_ = fVar6;
      auVar104._20_4_ = fVar6;
      auVar104._24_4_ = fVar6;
      auVar104._28_4_ = fVar6;
      auVar46 = vshufps_avx(auVar47,auVar47,0);
      auVar30 = vmovshdup_avx(auVar47);
      auVar58 = vshufps_avx(auVar47,auVar47,0x55);
      auVar41 = vshufpd_avx(auVar47,auVar47,1);
      auVar66 = vshufps_avx(auVar47,auVar47,0xaa);
      uVar29 = (ulong)(auVar47._0_4_ < 0.0) * 0x20;
      uVar25 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x40;
      uVar28 = (ulong)(auVar41._0_4_ < 0.0) << 5 | 0x80;
      auVar30 = vshufps_avx(auVar54,auVar54,0);
      auVar56._16_16_ = auVar30;
      auVar56._0_16_ = auVar30;
      auVar30 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
      auVar61._16_16_ = auVar30;
      auVar61._0_16_ = auVar30;
LAB_002e14e7:
      if (puVar27 != &local_11d8) {
        uVar23 = puVar27[-1];
        puVar27 = puVar27 + -1;
LAB_002e14f8:
        fVar44 = auVar46._12_4_;
        fVar36 = auVar58._12_4_;
        fVar35 = auVar66._12_4_;
        if ((uVar23 & 0xf) == 0) {
          auVar95 = vsubps_avx(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar29),auVar106);
          fVar37 = auVar46._0_4_;
          fVar40 = auVar46._4_4_;
          auVar10._4_4_ = fVar40 * auVar95._4_4_;
          auVar10._0_4_ = fVar37 * auVar95._0_4_;
          fVar42 = auVar46._8_4_;
          auVar10._8_4_ = fVar42 * auVar95._8_4_;
          auVar10._12_4_ = fVar44 * auVar95._12_4_;
          auVar10._16_4_ = fVar37 * auVar95._16_4_;
          auVar10._20_4_ = fVar40 * auVar95._20_4_;
          auVar10._24_4_ = fVar42 * auVar95._24_4_;
          auVar10._28_4_ = auVar95._28_4_;
          auVar95 = vsubps_avx(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar25),auVar65);
          fVar43 = auVar58._0_4_;
          fVar45 = auVar58._4_4_;
          auVar11._4_4_ = fVar45 * auVar95._4_4_;
          auVar11._0_4_ = fVar43 * auVar95._0_4_;
          fVar50 = auVar58._8_4_;
          auVar11._8_4_ = fVar50 * auVar95._8_4_;
          auVar11._12_4_ = fVar36 * auVar95._12_4_;
          auVar11._16_4_ = fVar43 * auVar95._16_4_;
          auVar11._20_4_ = fVar45 * auVar95._20_4_;
          auVar11._24_4_ = fVar50 * auVar95._24_4_;
          auVar11._28_4_ = auVar95._28_4_;
          auVar95 = vmaxps_avx(auVar10,auVar11);
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar28),auVar104);
          fVar51 = auVar66._0_4_;
          fVar52 = auVar66._4_4_;
          auVar12._4_4_ = fVar52 * auVar34._4_4_;
          auVar12._0_4_ = fVar51 * auVar34._0_4_;
          fVar53 = auVar66._8_4_;
          auVar12._8_4_ = fVar53 * auVar34._8_4_;
          auVar12._12_4_ = fVar35 * auVar34._12_4_;
          auVar12._16_4_ = fVar51 * auVar34._16_4_;
          auVar12._20_4_ = fVar52 * auVar34._20_4_;
          auVar12._24_4_ = fVar53 * auVar34._24_4_;
          auVar12._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar23 + 0x40 + (uVar29 ^ 0x20)),auVar106);
          auVar13._4_4_ = fVar40 * auVar34._4_4_;
          auVar13._0_4_ = fVar37 * auVar34._0_4_;
          auVar13._8_4_ = fVar42 * auVar34._8_4_;
          auVar13._12_4_ = fVar44 * auVar34._12_4_;
          auVar13._16_4_ = fVar37 * auVar34._16_4_;
          auVar13._20_4_ = fVar40 * auVar34._20_4_;
          auVar13._24_4_ = fVar42 * auVar34._24_4_;
          auVar13._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar23 + 0x40 + (uVar25 ^ 0x20)),auVar65);
          auVar14._4_4_ = fVar45 * auVar34._4_4_;
          auVar14._0_4_ = fVar43 * auVar34._0_4_;
          auVar14._8_4_ = fVar50 * auVar34._8_4_;
          auVar14._12_4_ = fVar36 * auVar34._12_4_;
          auVar14._16_4_ = fVar43 * auVar34._16_4_;
          auVar14._20_4_ = fVar45 * auVar34._20_4_;
          auVar14._24_4_ = fVar50 * auVar34._24_4_;
          auVar14._28_4_ = auVar34._28_4_;
          auVar39 = vminps_avx(auVar13,auVar14);
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar23 + 0x40 + (uVar28 ^ 0x20)),auVar104);
          auVar15._4_4_ = fVar52 * auVar34._4_4_;
          auVar15._0_4_ = fVar51 * auVar34._0_4_;
          auVar15._8_4_ = fVar53 * auVar34._8_4_;
          auVar15._12_4_ = fVar35 * auVar34._12_4_;
          auVar15._16_4_ = fVar51 * auVar34._16_4_;
          auVar15._20_4_ = fVar52 * auVar34._20_4_;
          auVar15._24_4_ = fVar53 * auVar34._24_4_;
          auVar15._28_4_ = auVar34._28_4_;
          auVar34 = vmaxps_avx(auVar12,auVar56);
          auVar95 = vmaxps_avx(auVar95,auVar34);
          auVar34 = vminps_avx(auVar15,auVar61);
          auVar34 = vminps_avx(auVar39,auVar34);
          auVar95 = vcmpps_avx(auVar95,auVar34,2);
          auVar30 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        }
        else {
          if ((int)(uVar23 & 0xf) != 2) {
            auVar85 = ZEXT1664(auVar85._0_16_);
            auVar96 = ZEXT1664(auVar96._0_16_);
            cVar21 = (**(code **)((long)This->leafIntersector +
                                 (ulong)*(byte *)(uVar23 & 0xfffffffffffffff0) * 0x40 + 8))
                               (local_1218,ray,context);
            if (cVar21 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_002e14e7;
          }
          uVar22 = uVar23 & 0xfffffffffffffff0;
          auVar20 = *(undefined1 (*) [12])(uVar22 + 0x80);
          fVar37 = *(float *)(uVar22 + 0xbc);
          auVar84._0_4_ =
               fVar1 * *(float *)(uVar22 + 0xa0) + fVar2 * *(float *)(uVar22 + 0x100) +
               fVar63 * *(float *)(uVar22 + 0x40);
          auVar84._4_4_ =
               fVar1 * *(float *)(uVar22 + 0xa4) + fVar2 * *(float *)(uVar22 + 0x104) +
               fVar63 * *(float *)(uVar22 + 0x44);
          auVar84._8_4_ =
               fVar1 * *(float *)(uVar22 + 0xa8) + fVar2 * *(float *)(uVar22 + 0x108) +
               fVar63 * *(float *)(uVar22 + 0x48);
          auVar84._12_4_ =
               fVar1 * *(float *)(uVar22 + 0xac) + fVar2 * *(float *)(uVar22 + 0x10c) +
               fVar63 * *(float *)(uVar22 + 0x4c);
          auVar84._16_4_ =
               fVar1 * *(float *)(uVar22 + 0xb0) + fVar2 * *(float *)(uVar22 + 0x110) +
               fVar63 * *(float *)(uVar22 + 0x50);
          auVar84._20_4_ =
               fVar1 * *(float *)(uVar22 + 0xb4) + fVar2 * *(float *)(uVar22 + 0x114) +
               fVar63 * *(float *)(uVar22 + 0x54);
          auVar84._24_4_ =
               fVar1 * *(float *)(uVar22 + 0xb8) + fVar2 * *(float *)(uVar22 + 0x118) +
               fVar63 * *(float *)(uVar22 + 0x58);
          auVar84._28_4_ = auVar85._28_4_ + fVar44 + fVar1;
          auVar94._0_4_ =
               fVar2 * *(float *)(uVar22 + 0x120) + fVar1 * *(float *)(uVar22 + 0xc0) +
               fVar63 * *(float *)(uVar22 + 0x60);
          auVar94._4_4_ =
               fVar2 * *(float *)(uVar22 + 0x124) + fVar1 * *(float *)(uVar22 + 0xc4) +
               fVar63 * *(float *)(uVar22 + 100);
          auVar94._8_4_ =
               fVar2 * *(float *)(uVar22 + 0x128) + fVar1 * *(float *)(uVar22 + 200) +
               fVar63 * *(float *)(uVar22 + 0x68);
          auVar94._12_4_ =
               fVar2 * *(float *)(uVar22 + 300) + fVar1 * *(float *)(uVar22 + 0xcc) +
               fVar63 * *(float *)(uVar22 + 0x6c);
          auVar94._16_4_ =
               fVar2 * *(float *)(uVar22 + 0x130) + fVar1 * *(float *)(uVar22 + 0xd0) +
               fVar63 * *(float *)(uVar22 + 0x70);
          auVar94._20_4_ =
               fVar2 * *(float *)(uVar22 + 0x134) + fVar1 * *(float *)(uVar22 + 0xd4) +
               fVar63 * *(float *)(uVar22 + 0x74);
          auVar94._24_4_ =
               fVar2 * *(float *)(uVar22 + 0x138) + fVar1 * *(float *)(uVar22 + 0xd8) +
               fVar63 * *(float *)(uVar22 + 0x78);
          auVar94._28_4_ = fVar36 + auVar96._28_4_ + fVar1;
          auVar74._0_4_ =
               fVar2 * *(float *)(uVar22 + 0x140) + fVar1 * *(float *)(uVar22 + 0xe0) +
               fVar63 * *(float *)*(undefined1 (*) [12])(uVar22 + 0x80);
          auVar74._4_4_ =
               fVar2 * *(float *)(uVar22 + 0x144) + fVar1 * *(float *)(uVar22 + 0xe4) +
               fVar63 * *(float *)(uVar22 + 0x84);
          auVar74._8_4_ =
               fVar2 * *(float *)(uVar22 + 0x148) + fVar1 * *(float *)(uVar22 + 0xe8) +
               fVar63 * *(float *)(uVar22 + 0x88);
          auVar74._12_4_ =
               fVar2 * *(float *)(uVar22 + 0x14c) + fVar1 * *(float *)(uVar22 + 0xec) +
               fVar63 * *(float *)(uVar22 + 0x8c);
          auVar74._16_4_ =
               fVar2 * *(float *)(uVar22 + 0x150) + fVar1 * *(float *)(uVar22 + 0xf0) +
               fVar63 * *(float *)(uVar22 + 0x90);
          auVar74._20_4_ =
               fVar2 * *(float *)(uVar22 + 0x154) + fVar1 * *(float *)(uVar22 + 0xf4) +
               fVar63 * *(float *)(uVar22 + 0x94);
          auVar74._24_4_ =
               fVar2 * *(float *)(uVar22 + 0x158) + fVar1 * *(float *)(uVar22 + 0xf8) +
               fVar63 * *(float *)(uVar22 + 0x98);
          auVar74._28_4_ = fVar35 + fVar1 + fVar1;
          auVar32._8_4_ = 0x7fffffff;
          auVar32._0_8_ = 0x7fffffff7fffffff;
          auVar32._12_4_ = 0x7fffffff;
          auVar32._16_4_ = 0x7fffffff;
          auVar32._20_4_ = 0x7fffffff;
          auVar32._24_4_ = 0x7fffffff;
          auVar32._28_4_ = 0x7fffffff;
          auVar95 = vandps_avx(auVar84,auVar32);
          auVar103._8_4_ = 0x219392ef;
          auVar103._0_8_ = 0x219392ef219392ef;
          auVar103._12_4_ = 0x219392ef;
          auVar103._16_4_ = 0x219392ef;
          auVar103._20_4_ = 0x219392ef;
          auVar103._24_4_ = 0x219392ef;
          auVar103._28_4_ = 0x219392ef;
          auVar95 = vcmpps_avx(auVar95,auVar103,1);
          auVar34 = vblendvps_avx(auVar84,auVar103,auVar95);
          auVar95 = vandps_avx(auVar94,auVar32);
          auVar95 = vcmpps_avx(auVar95,auVar103,1);
          auVar39 = vblendvps_avx(auVar94,auVar103,auVar95);
          auVar95 = vandps_avx(auVar74,auVar32);
          auVar95 = vcmpps_avx(auVar95,auVar103,1);
          auVar95 = vblendvps_avx(auVar74,auVar103,auVar95);
          auVar32 = vrcpps_avx(auVar34);
          fVar71 = auVar32._0_4_;
          fVar75 = auVar32._4_4_;
          auVar7._4_4_ = fVar75 * auVar34._4_4_;
          auVar7._0_4_ = fVar71 * auVar34._0_4_;
          fVar76 = auVar32._8_4_;
          auVar7._8_4_ = fVar76 * auVar34._8_4_;
          fVar77 = auVar32._12_4_;
          auVar7._12_4_ = fVar77 * auVar34._12_4_;
          fVar78 = auVar32._16_4_;
          auVar7._16_4_ = fVar78 * auVar34._16_4_;
          fVar79 = auVar32._20_4_;
          auVar7._20_4_ = fVar79 * auVar34._20_4_;
          fVar80 = auVar32._24_4_;
          auVar7._24_4_ = fVar80 * auVar34._24_4_;
          auVar7._28_4_ = auVar34._28_4_;
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = 0x3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar33._16_4_ = 0x3f800000;
          auVar33._20_4_ = 0x3f800000;
          auVar33._24_4_ = 0x3f800000;
          auVar33._28_4_ = 0x3f800000;
          auVar7 = vsubps_avx(auVar33,auVar7);
          auVar34 = vrcpps_avx(auVar39);
          fVar71 = fVar71 + fVar71 * auVar7._0_4_;
          fVar75 = fVar75 + fVar75 * auVar7._4_4_;
          fVar76 = fVar76 + fVar76 * auVar7._8_4_;
          fVar77 = fVar77 + fVar77 * auVar7._12_4_;
          fVar78 = fVar78 + fVar78 * auVar7._16_4_;
          fVar79 = fVar79 + fVar79 * auVar7._20_4_;
          fVar80 = fVar80 + fVar80 * auVar7._24_4_;
          fVar81 = auVar34._0_4_;
          fVar86 = auVar34._4_4_;
          auVar8._4_4_ = fVar86 * auVar39._4_4_;
          auVar8._0_4_ = fVar81 * auVar39._0_4_;
          fVar87 = auVar34._8_4_;
          auVar8._8_4_ = fVar87 * auVar39._8_4_;
          fVar88 = auVar34._12_4_;
          auVar8._12_4_ = fVar88 * auVar39._12_4_;
          fVar89 = auVar34._16_4_;
          auVar8._16_4_ = fVar89 * auVar39._16_4_;
          fVar90 = auVar34._20_4_;
          auVar8._20_4_ = fVar90 * auVar39._20_4_;
          fVar91 = auVar34._24_4_;
          auVar8._24_4_ = fVar91 * auVar39._24_4_;
          auVar8._28_4_ = auVar7._28_4_;
          auVar8 = vsubps_avx(auVar33,auVar8);
          auVar39 = vrcpps_avx(auVar95);
          fVar81 = fVar81 + fVar81 * auVar8._0_4_;
          fVar86 = fVar86 + fVar86 * auVar8._4_4_;
          fVar87 = fVar87 + fVar87 * auVar8._8_4_;
          fVar88 = fVar88 + fVar88 * auVar8._12_4_;
          fVar89 = fVar89 + fVar89 * auVar8._16_4_;
          fVar90 = fVar90 + fVar90 * auVar8._20_4_;
          fVar91 = fVar91 + fVar91 * auVar8._24_4_;
          fVar92 = auVar39._0_4_;
          fVar97 = auVar39._4_4_;
          auVar16._4_4_ = fVar97 * auVar95._4_4_;
          auVar16._0_4_ = fVar92 * auVar95._0_4_;
          fVar98 = auVar39._8_4_;
          auVar16._8_4_ = fVar98 * auVar95._8_4_;
          fVar99 = auVar39._12_4_;
          auVar16._12_4_ = fVar99 * auVar95._12_4_;
          fVar100 = auVar39._16_4_;
          auVar16._16_4_ = fVar100 * auVar95._16_4_;
          fVar101 = auVar39._20_4_;
          auVar16._20_4_ = fVar101 * auVar95._20_4_;
          fVar102 = auVar39._24_4_;
          auVar16._24_4_ = fVar102 * auVar95._24_4_;
          auVar16._28_4_ = auVar95._28_4_;
          auVar95 = vsubps_avx(auVar33,auVar16);
          fVar92 = fVar92 + fVar92 * auVar95._0_4_;
          fVar97 = fVar97 + fVar97 * auVar95._4_4_;
          fVar98 = fVar98 + fVar98 * auVar95._8_4_;
          fVar99 = fVar99 + fVar99 * auVar95._12_4_;
          fVar100 = fVar100 + fVar100 * auVar95._16_4_;
          fVar101 = fVar101 + fVar101 * auVar95._20_4_;
          fVar102 = fVar102 + fVar102 * auVar95._24_4_;
          fVar44 = *(float *)(uVar22 + 0x15c) + *(float *)(uVar22 + 0x1bc);
          fVar53 = *(float *)(uVar22 + 0x5c) +
                   fVar37 + *(float *)(uVar22 + 0x11c) + *(float *)(uVar22 + 0x17c);
          auVar48._0_4_ =
               -fVar71 * (fVar69 * *(float *)(uVar22 + 0x40) +
                         fVar5 * *(float *)(uVar22 + 0xa0) +
                         fVar6 * *(float *)(uVar22 + 0x100) + *(float *)(uVar22 + 0x160));
          auVar48._4_4_ =
               -fVar75 * (fVar69 * *(float *)(uVar22 + 0x44) +
                         fVar5 * *(float *)(uVar22 + 0xa4) +
                         fVar6 * *(float *)(uVar22 + 0x104) + *(float *)(uVar22 + 0x164));
          auVar48._8_4_ =
               -fVar76 * (fVar69 * *(float *)(uVar22 + 0x48) +
                         fVar5 * *(float *)(uVar22 + 0xa8) +
                         fVar6 * *(float *)(uVar22 + 0x108) + *(float *)(uVar22 + 0x168));
          auVar48._12_4_ =
               -fVar77 * (fVar69 * *(float *)(uVar22 + 0x4c) +
                         fVar5 * *(float *)(uVar22 + 0xac) +
                         fVar6 * *(float *)(uVar22 + 0x10c) + *(float *)(uVar22 + 0x16c));
          fVar50 = -fVar78 * (fVar69 * *(float *)(uVar22 + 0x50) +
                             fVar5 * *(float *)(uVar22 + 0xb0) +
                             fVar6 * *(float *)(uVar22 + 0x110) + *(float *)(uVar22 + 0x170));
          auVar17._16_4_ = fVar50;
          auVar17._0_16_ = auVar48;
          fVar51 = -fVar79 * (fVar69 * *(float *)(uVar22 + 0x54) +
                             fVar5 * *(float *)(uVar22 + 0xb4) +
                             fVar6 * *(float *)(uVar22 + 0x114) + *(float *)(uVar22 + 0x174));
          auVar17._20_4_ = fVar51;
          fVar52 = -fVar80 * (fVar69 * *(float *)(uVar22 + 0x58) +
                             fVar5 * *(float *)(uVar22 + 0xb8) +
                             fVar6 * *(float *)(uVar22 + 0x118) + *(float *)(uVar22 + 0x178));
          auVar17._24_4_ = fVar52;
          auVar17._28_4_ = fVar53;
          fVar45 = fVar44 + fVar37 + *(float *)(uVar22 + 0x13c) + *(float *)(uVar22 + 0x19c);
          auVar38._0_4_ =
               -fVar81 * (fVar69 * *(float *)(uVar22 + 0x60) +
                         fVar5 * *(float *)(uVar22 + 0xc0) +
                         fVar6 * *(float *)(uVar22 + 0x120) + *(float *)(uVar22 + 0x180));
          auVar38._4_4_ =
               -fVar86 * (fVar69 * *(float *)(uVar22 + 100) +
                         fVar5 * *(float *)(uVar22 + 0xc4) +
                         fVar6 * *(float *)(uVar22 + 0x124) + *(float *)(uVar22 + 0x184));
          auVar38._8_4_ =
               -fVar87 * (fVar69 * *(float *)(uVar22 + 0x68) +
                         fVar5 * *(float *)(uVar22 + 200) +
                         fVar6 * *(float *)(uVar22 + 0x128) + *(float *)(uVar22 + 0x188));
          auVar38._12_4_ =
               -fVar88 * (fVar69 * *(float *)(uVar22 + 0x6c) +
                         fVar5 * *(float *)(uVar22 + 0xcc) +
                         fVar6 * *(float *)(uVar22 + 300) + *(float *)(uVar22 + 0x18c));
          fVar40 = -fVar89 * (fVar69 * *(float *)(uVar22 + 0x70) +
                             fVar5 * *(float *)(uVar22 + 0xd0) +
                             fVar6 * *(float *)(uVar22 + 0x130) + *(float *)(uVar22 + 400));
          auVar18._16_4_ = fVar40;
          auVar18._0_16_ = auVar38;
          fVar42 = -fVar90 * (fVar69 * *(float *)(uVar22 + 0x74) +
                             fVar5 * *(float *)(uVar22 + 0xd4) +
                             fVar6 * *(float *)(uVar22 + 0x134) + *(float *)(uVar22 + 0x194));
          auVar18._20_4_ = fVar42;
          fVar43 = -fVar91 * (fVar69 * *(float *)(uVar22 + 0x78) +
                             fVar5 * *(float *)(uVar22 + 0xd8) +
                             fVar6 * *(float *)(uVar22 + 0x138) + *(float *)(uVar22 + 0x198));
          auVar18._24_4_ = fVar43;
          auVar18._28_4_ = fVar45;
          local_13b8 = auVar20._0_4_;
          fStack_13b4 = auVar20._4_4_;
          fStack_13b0 = auVar20._8_4_;
          fVar37 = fVar37 + fVar44 + -0.0;
          auVar31._0_4_ =
               -fVar92 * (fVar69 * local_13b8 +
                         *(float *)(uVar22 + 0xe0) * fVar5 +
                         fVar6 * *(float *)(uVar22 + 0x140) + *(float *)(uVar22 + 0x1a0));
          auVar31._4_4_ =
               -fVar97 * (fVar69 * fStack_13b4 +
                         *(float *)(uVar22 + 0xe4) * fVar5 +
                         fVar6 * *(float *)(uVar22 + 0x144) + *(float *)(uVar22 + 0x1a4));
          auVar31._8_4_ =
               -fVar98 * (fVar69 * fStack_13b0 +
                         *(float *)(uVar22 + 0xe8) * fVar5 +
                         fVar6 * *(float *)(uVar22 + 0x148) + *(float *)(uVar22 + 0x1a8));
          auVar31._12_4_ =
               -fVar99 * (fVar69 * *(float *)(uVar22 + 0x8c) +
                         *(float *)(uVar22 + 0xec) * fVar5 +
                         fVar6 * *(float *)(uVar22 + 0x14c) + *(float *)(uVar22 + 0x1ac));
          fVar44 = -fVar100 *
                   (fVar69 * *(float *)(uVar22 + 0x90) +
                   *(float *)(uVar22 + 0xf0) * fVar5 +
                   fVar6 * *(float *)(uVar22 + 0x150) + *(float *)(uVar22 + 0x1b0));
          auVar19._16_4_ = fVar44;
          auVar19._0_16_ = auVar31;
          fVar35 = -fVar101 *
                   (fVar69 * *(float *)(uVar22 + 0x94) +
                   *(float *)(uVar22 + 0xf4) * fVar5 +
                   fVar6 * *(float *)(uVar22 + 0x154) + *(float *)(uVar22 + 0x1b4));
          auVar19._20_4_ = fVar35;
          fVar36 = -fVar102 *
                   (fVar69 * *(float *)(uVar22 + 0x98) +
                   *(float *)(uVar22 + 0xf8) * fVar5 +
                   fVar6 * *(float *)(uVar22 + 0x158) + *(float *)(uVar22 + 0x1b8));
          auVar19._24_4_ = fVar36;
          auVar19._28_4_ = fVar37;
          auVar55._0_4_ = fVar71 + auVar48._0_4_;
          auVar55._4_4_ = fVar75 + auVar48._4_4_;
          auVar55._8_4_ = fVar76 + auVar48._8_4_;
          auVar55._12_4_ = fVar77 + auVar48._12_4_;
          auVar57._16_4_ = fVar78 + fVar50;
          auVar57._0_16_ = auVar55;
          auVar57._20_4_ = fVar79 + fVar51;
          auVar57._24_4_ = fVar80 + fVar52;
          auVar57._28_4_ = auVar32._28_4_ + auVar7._28_4_ + fVar53;
          auVar60._0_4_ = fVar81 + auVar38._0_4_;
          auVar60._4_4_ = fVar86 + auVar38._4_4_;
          auVar60._8_4_ = fVar87 + auVar38._8_4_;
          auVar60._12_4_ = fVar88 + auVar38._12_4_;
          auVar62._16_4_ = fVar89 + fVar40;
          auVar62._0_16_ = auVar60;
          auVar62._20_4_ = fVar90 + fVar42;
          auVar62._24_4_ = fVar91 + fVar43;
          auVar62._28_4_ = auVar34._28_4_ + auVar8._28_4_ + fVar45;
          auVar67._0_4_ = fVar92 + auVar31._0_4_;
          auVar67._4_4_ = fVar97 + auVar31._4_4_;
          auVar67._8_4_ = fVar98 + auVar31._8_4_;
          auVar67._12_4_ = fVar99 + auVar31._12_4_;
          auVar68._16_4_ = fVar100 + fVar44;
          auVar68._0_16_ = auVar67;
          auVar68._20_4_ = fVar101 + fVar35;
          auVar68._24_4_ = fVar102 + fVar36;
          auVar68._28_4_ = auVar39._28_4_ + auVar95._28_4_ + fVar37;
          auVar30 = vpminsd_avx(auVar17._16_16_,auVar57._16_16_);
          auVar54 = vpminsd_avx(auVar48,auVar55);
          auVar70._16_16_ = auVar30;
          auVar70._0_16_ = auVar54;
          auVar41 = auVar18._16_16_;
          auVar85 = ZEXT1664(auVar41);
          auVar30 = vpminsd_avx(auVar41,auVar62._16_16_);
          auVar54 = vpminsd_avx(auVar38,auVar60);
          auVar95._16_16_ = auVar30;
          auVar95._0_16_ = auVar54;
          auVar30 = vpminsd_avx(auVar19._16_16_,auVar68._16_16_);
          auVar54 = vpminsd_avx(auVar31,auVar67);
          auVar105._16_16_ = auVar30;
          auVar105._0_16_ = auVar54;
          auVar95 = vmaxps_avx(auVar95,auVar105);
          auVar96 = ZEXT3264(auVar95);
          auVar30 = vpmaxsd_avx(auVar17._16_16_,auVar57._16_16_);
          auVar54 = vpmaxsd_avx(auVar48,auVar55);
          auVar49._16_16_ = auVar30;
          auVar49._0_16_ = auVar54;
          auVar30 = vpmaxsd_avx(auVar41,auVar62._16_16_);
          auVar54 = vpmaxsd_avx(auVar38,auVar60);
          auVar39._16_16_ = auVar30;
          auVar39._0_16_ = auVar54;
          auVar30 = vpmaxsd_avx(auVar19._16_16_,auVar68._16_16_);
          auVar54 = vpmaxsd_avx(auVar31,auVar67);
          auVar34._16_16_ = auVar30;
          auVar34._0_16_ = auVar54;
          auVar39 = vminps_avx(auVar39,auVar34);
          auVar34 = vmaxps_avx(auVar56,auVar70);
          auVar95 = vmaxps_avx(auVar34,auVar95);
          auVar34 = vminps_avx(auVar61,auVar49);
          auVar34 = vminps_avx(auVar34,auVar39);
          auVar95 = vcmpps_avx(auVar95,auVar34,2);
          auVar30 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        }
        auVar30 = vpsllw_avx(auVar30,0xf);
        if ((((((((auVar30 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar30 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar30 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar30 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf]
           ) goto LAB_002e14e7;
        auVar30 = vpacksswb_avx(auVar30,auVar30);
        bVar9 = SUB161(auVar30 >> 7,0) & 1 | (SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar30 >> 0x17,0) & 1) << 2 | (SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar30 >> 0x27,0) & 1) << 4 | (SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar30 >> 0x37,0) & 1) << 6 | SUB161(auVar30 >> 0x3f,0) << 7;
        uVar22 = uVar23 & 0xfffffffffffffff0;
        lVar4 = 0;
        if (bVar9 != 0) {
          for (; (bVar9 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar23 = *(ulong *)(uVar22 + lVar4 * 8);
        uVar26 = bVar9 - 1 & (uint)bVar9;
        if (uVar26 != 0) {
          *puVar27 = uVar23;
          puVar27 = puVar27 + 1;
          lVar4 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar23 = *(ulong *)(uVar22 + lVar4 * 8);
          uVar26 = uVar26 - 1 & uVar26;
          uVar24 = (ulong)uVar26;
          if (uVar26 != 0) {
            do {
              *puVar27 = uVar23;
              puVar27 = puVar27 + 1;
              lVar4 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              uVar23 = *(ulong *)(uVar22 + lVar4 * 8);
              uVar24 = uVar24 & uVar24 - 1;
            } while (uVar24 != 0);
          }
        }
        goto LAB_002e14f8;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }